

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

size_t __thiscall
absl::lts_20250127::container_internal::PrepareInsertNonSoo
          (container_internal *this,CommonFields *common,size_t hash,FindInfo target,
          PolicyFunctions *policy)

{
  _func_void_CommonFields_ptr_size_t_HashtablezInfoHandle *p_Var1;
  CommonFields *i;
  bool bVar2;
  h2_t h;
  GrowthInfo *pGVar3;
  size_t sVar4;
  size_t sVar5;
  ctrl_t *pcVar6;
  HashtablezInfoHandle in_stack_ffffffffffffff28;
  size_t local_c0;
  HashtablezInfoHandle local_91;
  FindInfo local_90;
  FindInfo local_80;
  size_t local_68;
  size_t cap;
  undefined1 auStack_58 [7];
  bool rehash_for_bug_detection;
  size_t local_50;
  size_t local_40;
  size_t old_capacity;
  PolicyFunctions *pPStack_30;
  bool use_target_hint;
  PolicyFunctions *policy_local;
  size_t hash_local;
  CommonFields *common_local;
  FindInfo target_local;
  
  pPStack_30 = (PolicyFunctions *)target.probe_length;
  target_local.offset = target.offset;
  policy_local = (PolicyFunctions *)common;
  hash_local = (size_t)this;
  common_local = (CommonFields *)hash;
  pGVar3 = CommonFields::growth_info((CommonFields *)this);
  old_capacity._7_1_ = GrowthInfo::HasNoDeletedAndGrowthLeft(pGVar3);
  if (((old_capacity._7_1_ ^ 0xff) & 1) != 0) {
    pGVar3 = CommonFields::growth_info((CommonFields *)hash_local);
    bVar2 = GrowthInfo::HasNoGrowthLeftAndNoDeleted(pGVar3);
    if (bVar2) {
      local_40 = CommonFields::capacity((CommonFields *)hash_local);
      sVar5 = hash_local;
      p_Var1 = pPStack_30->resize;
      sVar4 = NextCapacity(local_40);
      (*p_Var1)((CommonFields *)sVar5,sVar4,in_stack_ffffffffffffff28);
      _auStack_58 = HashSetResizeHelper::FindFirstNonFullAfterResize
                              ((CommonFields *)hash_local,local_40,(size_t)policy_local);
      common_local = _auStack_58;
      target_local.offset = local_50;
    }
    else {
      cap._7_1_ = CommonFields::should_rehash_for_bug_detection_on_insert
                            ((CommonFields *)hash_local);
      if ((bool)cap._7_1_) {
        local_68 = CommonFields::capacity((CommonFields *)hash_local);
        sVar5 = hash_local;
        p_Var1 = pPStack_30->resize;
        sVar4 = CommonFields::growth_left((CommonFields *)hash_local);
        if (sVar4 == 0) {
          local_c0 = NextCapacity(local_68);
        }
        else {
          local_c0 = local_68;
        }
        (*p_Var1)((CommonFields *)sVar5,local_c0,in_stack_ffffffffffffff28);
      }
      sVar5 = CommonFields::growth_left((CommonFields *)hash_local);
      if (sVar5 == 0) {
        local_90 = anon_unknown_2::FindInsertPositionWithGrowthOrRehash
                             ((CommonFields *)hash_local,(size_t)policy_local,pPStack_30);
        common_local = (CommonFields *)local_90.offset;
        target_local.offset = local_90.probe_length;
      }
      else {
        local_80 = find_first_non_full<void>((CommonFields *)hash_local,(size_t)policy_local);
        common_local = (CommonFields *)local_80.offset;
        target_local.offset = local_80.probe_length;
      }
    }
  }
  PrepareInsertCommon((CommonFields *)hash_local);
  pGVar3 = CommonFields::growth_info((CommonFields *)hash_local);
  pcVar6 = CommonFields::control((CommonFields *)hash_local);
  GrowthInfo::OverwriteControlAsFull(pGVar3,pcVar6[(long)common_local]);
  i = common_local;
  sVar5 = hash_local;
  h = H2((size_t)policy_local);
  SetCtrl((CommonFields *)sVar5,(size_t)i,h,pPStack_30->slot_size);
  CommonFields::infoz((CommonFields *)hash_local);
  HashtablezInfoHandle::RecordInsert(&local_91,(size_t)policy_local,target_local.offset);
  return (size_t)common_local;
}

Assistant:

size_t PrepareInsertNonSoo(CommonFields& common, size_t hash, FindInfo target,
                           const PolicyFunctions& policy) {
  // When there are no deleted slots in the table
  // and growth_left is positive, we can insert at the first
  // empty slot in the probe sequence (target).
  const bool use_target_hint =
      // Optimization is disabled when generations are enabled.
      // We have to rehash even sparse tables randomly in such mode.
      !SwisstableGenerationsEnabled() &&
      common.growth_info().HasNoDeletedAndGrowthLeft();
  if (ABSL_PREDICT_FALSE(!use_target_hint)) {
    // Notes about optimized mode when generations are disabled:
    // We do not enter this branch if table has no deleted slots
    // and growth_left is positive.
    // We enter this branch in the following cases listed in decreasing
    // frequency:
    // 1. Table without deleted slots (>95% cases) that needs to be resized.
    // 2. Table with deleted slots that has space for the inserting element.
    // 3. Table with deleted slots that needs to be rehashed or resized.
    if (ABSL_PREDICT_TRUE(common.growth_info().HasNoGrowthLeftAndNoDeleted())) {
      const size_t old_capacity = common.capacity();
      policy.resize(common, NextCapacity(old_capacity), HashtablezInfoHandle{});
      target = HashSetResizeHelper::FindFirstNonFullAfterResize(
          common, old_capacity, hash);
    } else {
      // Note: the table may have no deleted slots here when generations
      // are enabled.
      const bool rehash_for_bug_detection =
          common.should_rehash_for_bug_detection_on_insert();
      if (rehash_for_bug_detection) {
        // Move to a different heap allocation in order to detect bugs.
        const size_t cap = common.capacity();
        policy.resize(common,
                      common.growth_left() > 0 ? cap : NextCapacity(cap),
                      HashtablezInfoHandle{});
      }
      if (ABSL_PREDICT_TRUE(common.growth_left() > 0)) {
        target = find_first_non_full(common, hash);
      } else {
        target = FindInsertPositionWithGrowthOrRehash(common, hash, policy);
      }
    }
  }
  PrepareInsertCommon(common);
  common.growth_info().OverwriteControlAsFull(common.control()[target.offset]);
  SetCtrl(common, target.offset, H2(hash), policy.slot_size);
  common.infoz().RecordInsert(hash, target.probe_length);
  return target.offset;
}